

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void printexpr(FILE *out,expr *expr,int lvl)

{
  uint uVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  expr *expr_00;
  char *pcVar6;
  char *__format;
  
LAB_00171ae7:
  iVar3 = 7;
  lVar4 = 0x20;
  switch(expr->type) {
  case EXPR_NUM:
    uVar1 = expr->special - 1;
    if (uVar1 < 3) {
      ppcVar2 = (char **)(&PTR_cbtarg_0017adc8)[uVar1];
    }
    else {
      ppcVar2 = &cnum;
    }
    fputs(*ppcVar2,(FILE *)out);
    pcVar5 = (char *)expr->num1;
    if ((long)pcVar5 < 0) {
      pcVar5 = (char *)-(long)pcVar5;
      pcVar6 = "-%#llx";
    }
    else {
      pcVar6 = "%#llx";
    }
LAB_00171ff7:
    fprintf((FILE *)out,pcVar6,pcVar5);
    return;
  case EXPR_ID:
    pcVar5 = expr->str;
    if (expr->special == 2) {
      ppcVar2 = &cunk;
    }
    else if (expr->special == 1) {
      ppcVar2 = &cnum;
    }
    else {
      ppcVar2 = &cname;
    }
    pcVar6 = *ppcVar2;
    __format = "%s%s";
    goto LAB_00172215;
  case EXPR_LABEL:
    pcVar5 = expr->str;
    if (expr->special == 2) {
      ppcVar2 = &cunk;
    }
    else {
      ppcVar2 = &cnum;
    }
    pcVar6 = *ppcVar2;
    __format = "%s#%s";
    goto LAB_00172215;
  case EXPR_REG:
    pcVar5 = expr->str;
    if (expr->special == 2) {
      ppcVar2 = &cunk;
    }
    else if (expr->special == 1) {
      ppcVar2 = &creg1;
    }
    else {
      ppcVar2 = &creg0;
    }
    pcVar6 = *ppcVar2;
    __format = "%s$%s";
LAB_00172215:
    fprintf((FILE *)out,__format,pcVar6,pcVar5);
    return;
  case EXPR_MEM:
    if (expr->str != (char *)0x0) {
      fprintf((FILE *)out,"%s%s[",cmem);
    }
    printexpr(out,expr->expr1,0);
    if (expr->str == (char *)0x0) {
      return;
    }
    pcVar6 = "%s]";
    pcVar5 = cmem;
    goto LAB_00171ff7;
  case EXPR_VEC:
    fprintf((FILE *)out,"%s{",cnorm);
    if (0 < expr->vexprsnum) {
      lVar4 = 0;
      do {
        fputc(0x20,(FILE *)out);
        printexpr(out,expr->vexprs[lVar4],0);
        lVar4 = lVar4 + 1;
      } while (lVar4 < expr->vexprsnum);
    }
    pcVar6 = " %s}";
    pcVar5 = cnorm;
    goto LAB_00171ff7;
  case EXPR_DISCARD:
    pcVar6 = "%s#";
    pcVar5 = creg0;
    goto LAB_00171ff7;
  case EXPR_BITFIELD:
    fprintf((FILE *)out,"%s%lld:%lld",cnum,expr->num1,expr->num2);
    return;
  case EXPR_NEG:
    goto switchD_00171b07_caseD_8;
  case EXPR_NOT:
    pcVar5 = "%s~";
    lvl = iVar3;
    break;
  case EXPR_MUL:
    if (6 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,6);
      pcVar5 = "%s*";
LAB_00171f8e:
      fprintf((FILE *)out,pcVar5,cmem);
      expr_00 = expr->expr2;
      iVar3 = 7;
LAB_00171fe8:
      printexpr(out,expr_00,iVar3);
      goto switchD_00171b07_caseD_16;
    }
    printexpr(out,expr->expr1,6);
    lVar4 = 0x28;
    pcVar5 = "%s*";
    lvl = iVar3;
    break;
  case EXPR_DIV:
    if (6 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,6);
      pcVar5 = "%s/";
      goto LAB_00171f8e;
    }
    printexpr(out,expr->expr1,6);
    lVar4 = 0x28;
    pcVar5 = "%s/";
    lvl = iVar3;
    break;
  case EXPR_ADD:
    if (5 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,5);
      pcVar5 = "%s+";
LAB_00171f13:
      fprintf((FILE *)out,pcVar5,cmem);
      expr_00 = expr->expr2;
      iVar3 = 6;
      goto LAB_00171fe8;
    }
    printexpr(out,expr->expr1,5);
    lVar4 = 0x28;
    pcVar5 = "%s+";
    lvl = 6;
    break;
  case EXPR_SUB:
    if (5 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,5);
      pcVar5 = "%s-";
      goto LAB_00171f13;
    }
    printexpr(out,expr->expr1,5);
    iVar3 = 6;
    lVar4 = 0x28;
    goto switchD_00171b07_caseD_8;
  case EXPR_SHL:
    if (4 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,4);
      pcVar5 = "%s<<";
LAB_00171e35:
      fprintf((FILE *)out,pcVar5,cmem);
      expr_00 = expr->expr2;
      iVar3 = 5;
      goto LAB_00171fe8;
    }
    printexpr(out,expr->expr1,4);
    lVar4 = 0x28;
    pcVar5 = "%s<<";
    lvl = 5;
    break;
  case EXPR_SHR:
    if (4 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,4);
      pcVar5 = "%s>>";
      goto LAB_00171e35;
    }
    printexpr(out,expr->expr1,4);
    lVar4 = 0x28;
    pcVar5 = "%s>>";
    lvl = 5;
    break;
  case EXPR_AND:
    if (3 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,3);
      fprintf((FILE *)out,"%s&",cmem);
      expr_00 = expr->expr2;
      iVar3 = 4;
      goto LAB_00171fe8;
    }
    printexpr(out,expr->expr1,3);
    lVar4 = 0x28;
    pcVar5 = "%s&";
    lvl = 4;
    break;
  case EXPR_XOR:
    if (2 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,2);
      fprintf((FILE *)out,"%s^",cmem);
      expr_00 = expr->expr2;
      iVar3 = 3;
      goto LAB_00171fe8;
    }
    printexpr(out,expr->expr1,2);
    lVar4 = 0x28;
    pcVar5 = "%s^";
    lvl = 3;
    break;
  case EXPR_OR:
    if (1 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,1);
      fprintf((FILE *)out,"%s|",cmem);
      expr_00 = expr->expr2;
      iVar3 = 2;
      goto LAB_00171fe8;
    }
    printexpr(out,expr->expr1,1);
    lVar4 = 0x28;
    pcVar5 = "%s|";
    lvl = 2;
    break;
  case EXPR_PIADD:
    if (0 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,0);
      pcVar5 = "%s++";
LAB_00171fd2:
      fprintf((FILE *)out,pcVar5,cmem);
      expr_00 = expr->expr2;
      iVar3 = 1;
      goto LAB_00171fe8;
    }
    printexpr(out,expr->expr1,0);
    lVar4 = 0x28;
    pcVar5 = "%s++";
    lvl = 1;
    break;
  case EXPR_PISUB:
    if (0 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,0);
      pcVar5 = "%s--";
      goto LAB_00171fd2;
    }
    printexpr(out,expr->expr1,0);
    lVar4 = 0x28;
    pcVar5 = "%s--";
    lvl = 1;
    break;
  case EXPR_SESTART:
    pcVar6 = "%s(";
    pcVar5 = cmem;
    goto LAB_00171ff7;
  case EXPR_SEEND:
switchD_00171b07_caseD_16:
    pcVar6 = "%s)";
    pcVar5 = cmem;
    goto LAB_00171ff7;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/print.c"
                  ,0xdd,"void printexpr(FILE *, const struct expr *, int)");
  }
LAB_00171d0d:
  fprintf((FILE *)out,pcVar5,cmem);
  expr = *(expr **)((long)&expr->type + lVar4);
  goto LAB_00171ae7;
switchD_00171b07_caseD_8:
  pcVar5 = "%s-";
  lvl = iVar3;
  goto LAB_00171d0d;
}

Assistant:

void printexpr(FILE *out, const struct expr *expr, int lvl) {
	int i;
	switch (expr->type) {
		case EXPR_NUM:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s", cbtarg);
					break;
				case 2:
					fprintf(out, "%s", cctarg);
					break;
				case 3:
					fprintf(out, "%s", cmem);
					break;
				default:
					fprintf(out, "%s", cnum);
					break;
			}
			if (expr->num1 & 1ull << 63)
				fprintf(out, "-%#llx", -expr->num1);
			else
				fprintf(out, "%#llx", expr->num1);
			return;
		case EXPR_ID:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s%s", cnum, expr->str);
					break;
				case 2:
					fprintf(out, "%s%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s%s", cname, expr->str);
					break;
			}
			return;
		case EXPR_LABEL:
			switch (expr->special) {
				case 2:
					fprintf(out, "%s#%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s#%s", cnum, expr->str);
					break;
			}
			return;
		case EXPR_REG:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s$%s", creg1, expr->str);
					break;
				case 2:
					fprintf(out, "%s$%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s$%s", creg0, expr->str);
					break;
			}
			return;
		case EXPR_MEM:
			if (expr->str)
				fprintf(out, "%s%s[", cmem, expr->str);
			printexpr(out, expr->expr1, 0);
			if (expr->str)
				fprintf(out, "%s]", cmem);
			return;
		case EXPR_VEC:
			fprintf(out, "%s{", cnorm);
			for (i = 0; i < expr->vexprsnum; i++) {
				fprintf(out, " ");
				printexpr(out, expr->vexprs[i], 0);
			}
			fprintf(out, " %s}", cnorm);
			return;
		case EXPR_DISCARD:
			fprintf(out, "%s#", creg0);
			return;
		case EXPR_BITFIELD:
			fprintf(out, "%s%lld:%lld", cnum, expr->num1, expr->num2);
			return;
		case EXPR_NEG:
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_NOT:
			fprintf(out, "%s~", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_MUL:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s*", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_DIV:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s/", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_ADD:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s+", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SUB:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHL:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s<<", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHR:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s>>", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_AND:
			if (lvl >= 4)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 3);
			fprintf(out, "%s&", cmem);
			printexpr(out, expr->expr2, 4);
			if (lvl >= 4)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_XOR:
			if (lvl >= 3)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 2);
			fprintf(out, "%s^", cmem);
			printexpr(out, expr->expr2, 3);
			if (lvl >= 3)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_OR:
			if (lvl >= 2)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 1);
			fprintf(out, "%s|", cmem);
			printexpr(out, expr->expr2, 2);
			if (lvl >= 2)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PIADD:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s++", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PISUB:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s--", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SESTART:
			fprintf(out, "%s(", cmem);
			return;
		case EXPR_SEEND:
			fprintf(out, "%s)", cmem);
			return;
		default:
			assert(0);
	}
}